

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmTest * __thiscall cmMakefile::CreateTest(cmMakefile *this,string *testName)

{
  __uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_> __p;
  const_iterator cVar1;
  _Head_base<0UL,_cmTest_*,_false> this_00;
  __uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_> *this_01;
  __single_object newTest;
  __uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_> local_28;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>_>_>_>
          ::find(&(this->Tests)._M_t,testName);
  if (((_Rb_tree_header *)cVar1._M_node == &(this->Tests)._M_t._M_impl.super__Rb_tree_header) ||
     (this_00._M_head_impl = *(cmTest **)(cVar1._M_node + 2), this_00._M_head_impl == (cmTest *)0x0)
     ) {
    this_00._M_head_impl = (cmTest *)operator_new(0x98);
    cmTest::cmTest(this_00._M_head_impl,this);
    local_28._M_t.super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
    super__Head_base<0UL,_cmTest_*,_false>._M_head_impl =
         (tuple<cmTest_*,_std::default_delete<cmTest>_>)
         (tuple<cmTest_*,_std::default_delete<cmTest>_>)this_00._M_head_impl;
    cmTest::SetName(this_00._M_head_impl,testName);
    this_01 = (__uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>_>_>_>
              ::operator[](&this->Tests,testName);
    __p._M_t.super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
    super__Head_base<0UL,_cmTest_*,_false>._M_head_impl =
         local_28._M_t.super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
         super__Head_base<0UL,_cmTest_*,_false>._M_head_impl;
    local_28._M_t.super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
    super__Head_base<0UL,_cmTest_*,_false>._M_head_impl =
         (tuple<cmTest_*,_std::default_delete<cmTest>_>)
         (_Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>)0x0;
    std::__uniq_ptr_impl<cmTest,_std::default_delete<cmTest>_>::reset
              (this_01,(pointer)__p._M_t.
                                super__Tuple_impl<0UL,_cmTest_*,_std::default_delete<cmTest>_>.
                                super__Head_base<0UL,_cmTest_*,_false>._M_head_impl);
    std::unique_ptr<cmTest,_std::default_delete<cmTest>_>::~unique_ptr
              ((unique_ptr<cmTest,_std::default_delete<cmTest>_> *)&local_28);
  }
  return this_00._M_head_impl;
}

Assistant:

cmTest* cmMakefile::CreateTest(const std::string& testName)
{
  cmTest* test = this->GetTest(testName);
  if (test) {
    return test;
  }
  auto newTest = cm::make_unique<cmTest>(this);
  test = newTest.get();
  newTest->SetName(testName);
  this->Tests[testName] = std::move(newTest);
  return test;
}